

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp-mpiu.c
# Opt level: O0

int MPIU_GetLoc(void *base,MPI_Datatype type,MPI_Op op,MPI_Comm comm)

{
  int iVar1;
  int local_50;
  int local_4c;
  int ret;
  int rank;
  int NTask;
  int ThisTask;
  void *tmp;
  ptrdiff_t elsize;
  ptrdiff_t lb;
  MPI_Comm comm_local;
  MPI_Op op_local;
  MPI_Datatype type_local;
  void *base_local;
  
  lb = (ptrdiff_t)comm;
  comm_local = (MPI_Comm)op;
  op_local = (MPI_Op)type;
  type_local = (MPI_Datatype)base;
  MPI_Type_get_extent(type,&elsize,&tmp);
  _NTask = malloc((size_t)tmp);
  MPI_Allreduce(type_local,_NTask,1,op_local,comm_local,lb);
  MPI_Comm_size(lb,&ret);
  MPI_Comm_rank(lb,&rank);
  local_4c = ret;
  local_50 = -1;
  iVar1 = memcmp(type_local,_NTask,(size_t)tmp);
  if (iVar1 == 0) {
    local_4c = rank;
  }
  MPI_Allreduce(&local_4c,&local_50,1,&ompi_mpi_int,&ompi_mpi_op_min,lb);
  free(_NTask);
  return local_50;
}

Assistant:

int
MPIU_GetLoc(const void * base, MPI_Datatype type, MPI_Op op, MPI_Comm comm)
{
    ptrdiff_t lb;
    ptrdiff_t elsize;
    MPI_Type_get_extent(type, &lb, &elsize);

    void * tmp = malloc(elsize);
    /* find the result of the reduction. */
    MPI_Allreduce(base, tmp, 1, type, op, comm);

    int ThisTask;
    int NTask;
    MPI_Comm_size(comm, &NTask);
    MPI_Comm_rank(comm, &ThisTask);
    int rank = NTask;
    int ret = -1;
    if (memcmp(base, tmp, elsize) == 0) {
        rank = ThisTask;
    }
    /* find the rank that is the same as the reduction result */
    /* avoid MPI_IN_PLACE, since if we are using this code, we have assumed we are using
     * a crazy MPI impl...
     * */
    MPI_Allreduce(&rank, &ret, 1, MPI_INT, MPI_MIN, comm);
    free(tmp);
    return ret;
}